

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_cell_query.cc
# Opt level: O2

bool __thiscall
S2ClosestCellQuery::IsDistanceLess(S2ClosestCellQuery *this,Target *target,S1ChordAngle limit)

{
  undefined1 uVar1;
  undefined3 uVar2;
  Options tmp_options;
  Result local_60;
  Options local_48;
  
  local_48.max_error_.length2_ = (this->options_).super_Options.max_error_.length2_;
  local_48.region_ = (this->options_).super_Options.region_;
  uVar1 = (this->options_).super_Options.use_brute_force_;
  uVar2 = *(undefined3 *)&(this->options_).super_Options.field_0x1d;
  local_48._29_3_ = uVar2;
  local_48.use_brute_force_ = (bool)uVar1;
  local_48.max_results_ = 1;
  local_48.max_distance_.super_S1ChordAngle.length2_ = (S1ChordAngle)(S1ChordAngle)limit.length2_;
  local_48.max_error_.length2_ = (double)S1ChordAngle::Straight();
  S2ClosestCellQueryBase<S2MinDistance>::FindClosestCell(&local_60,&this->base_,target,&local_48);
  return local_60.cell_id_.id_ != 0;
}

Assistant:

bool S2ClosestCellQuery::IsDistanceLess(Target* target, S1ChordAngle limit) {
  static_assert(sizeof(Options) <= 32, "Consider not copying Options here");
  Options tmp_options = options_;
  tmp_options.set_max_results(1);
  tmp_options.set_max_distance(limit);
  tmp_options.set_max_error(S1ChordAngle::Straight());
  return !base_.FindClosestCell(target, tmp_options).is_empty();
}